

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O1

void __thiscall QNativeIpcKey::~QNativeIpcKey(QNativeIpcKey *this)

{
  Data *pDVar1;
  
  if (this->d != (QNativeIpcKeyPrivate *)0x0) {
    destroy_internal(this);
  }
  pDVar1 = (this->key).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->key).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QNativeIpcKey()
    {
        if (isSlowPath())
            destroy_internal();
    }